

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O1

SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator=(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *sv)

{
  int32_t iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  int iVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  byte bVar9;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar9 = 0;
  if (this != sv) {
    iVar4 = sv->memused;
    if (iVar4 == 0) {
      iVar7 = 0;
    }
    else {
      this_00 = sv->m_elem;
      pNVar8 = this->m_elem;
      iVar7 = 0;
      do {
        if ((this_00->val).m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00507f16:
          pNVar5 = this_00;
          pNVar6 = pNVar8;
          for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pNVar6->val).m_backend.data._M_elems[0] = (pNVar5->val).m_backend.data._M_elems[0];
            pNVar5 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)pNVar5 + (ulong)bVar9 * -8 + 4);
            pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)pNVar6 + ((ulong)bVar9 * -2 + 1) * 4);
          }
          (pNVar8->val).m_backend.exp = (this_00->val).m_backend.exp;
          (pNVar8->val).m_backend.neg = (this_00->val).m_backend.neg;
          iVar1 = (this_00->val).m_backend.prec_elem;
          (pNVar8->val).m_backend.fpclass = (this_00->val).m_backend.fpclass;
          (pNVar8->val).m_backend.prec_elem = iVar1;
          pNVar8->idx = this_00->idx;
          pNVar8 = pNVar8 + 1;
          iVar7 = iVar7 + 1;
        }
        else {
          local_b8.fpclass = cpp_dec_float_finite;
          local_b8.prec_elem = 0x1c;
          local_b8.data._M_elems[0] = 0;
          local_b8.data._M_elems[1] = 0;
          local_b8.data._M_elems[2] = 0;
          local_b8.data._M_elems[3] = 0;
          local_b8.data._M_elems[4] = 0;
          local_b8.data._M_elems[5] = 0;
          local_b8.data._M_elems[6] = 0;
          local_b8.data._M_elems[7] = 0;
          local_b8.data._M_elems[8] = 0;
          local_b8.data._M_elems[9] = 0;
          local_b8.data._M_elems[10] = 0;
          local_b8.data._M_elems[0xb] = 0;
          local_b8.data._M_elems[0xc] = 0;
          local_b8.data._M_elems[0xd] = 0;
          local_b8.data._M_elems[0xe] = 0;
          local_b8.data._M_elems[0xf] = 0;
          local_b8.data._M_elems[0x10] = 0;
          local_b8.data._M_elems[0x11] = 0;
          local_b8.data._M_elems[0x12] = 0;
          local_b8.data._M_elems[0x13] = 0;
          local_b8.data._M_elems[0x14] = 0;
          local_b8.data._M_elems[0x15] = 0;
          local_b8.data._M_elems[0x16] = 0;
          local_b8.data._M_elems[0x17] = 0;
          local_b8.data._M_elems[0x18] = 0;
          local_b8.data._M_elems[0x19] = 0;
          local_b8.data._M_elems._104_5_ = 0;
          local_b8.data._M_elems[0x1b]._1_3_ = 0;
          local_b8.exp = 0;
          local_b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
          iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)this_00,&local_b8);
          if (iVar2 != 0) goto LAB_00507f16;
        }
        iVar4 = iVar4 + -1;
        this_00 = this_00 + 1;
      } while (iVar4 != 0);
    }
    this->memused = iVar7;
  }
  return this;
}

Assistant:

SVectorBase<R>& operator=(const SVectorBase<R>& sv)
   {
      if(this != &sv)
      {
         assert(max() >= sv.size());

         int i = sv.size();
         int nnz = 0;
         Nonzero<R>* e = m_elem;
         const Nonzero<R>* s = sv.m_elem;

         while(i--)
         {
            assert(e != nullptr);

            if(s->val != 0.0)
            {
               *e++ = *s;
               ++nnz;
            }

            ++s;
         }

         set_size(nnz);
      }

      return *this;
   }